

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O2

int stdio_over_pipes_helper(void)

{
  uv_handle_type uVar1;
  int iVar2;
  uv_loop_t *puVar3;
  size_t sVar4;
  undefined8 uVar5;
  uv_write_t *req;
  char *pcVar6;
  long lVar7;
  uv_buf_t uVar8;
  uv_buf_t buf [7];
  uv_write_t write_req [7];
  
  puVar3 = uv_default_loop();
  uVar1 = uv_guess_handle(0);
  if (uVar1 == UV_NAMED_PIPE) {
    uVar1 = uv_guess_handle(1);
    if (uVar1 == UV_NAMED_PIPE) {
      iVar2 = uv_pipe_init(puVar3,&stdin_pipe,0);
      if (iVar2 == 0) {
        iVar2 = uv_pipe_init(puVar3,&stdout_pipe,0);
        if (iVar2 == 0) {
          uv_pipe_open(&stdin_pipe,0);
          uv_pipe_open(&stdout_pipe,1);
          uv_unref((uv_handle_t *)&stdin_pipe);
          uv_unref((uv_handle_t *)&stdout_pipe);
          for (lVar7 = 0; lVar7 != 0x38; lVar7 = lVar7 + 8) {
            pcVar6 = *(char **)((long)&PTR_anon_var_dwarf_6f732_001afce0 + lVar7);
            sVar4 = strlen(pcVar6);
            uVar8 = uv_buf_init(pcVar6,(uint)sVar4);
            *(char **)((long)&buf[0].base + lVar7 * 2) = uVar8.base;
            *(size_t *)((long)&buf[0].len + lVar7 * 2) = uVar8.len;
          }
          lVar7 = 0;
          req = write_req;
          do {
            if (lVar7 + 0x10 == 0x80) {
              notify_parent_process();
              uv_run(puVar3,UV_RUN_DEFAULT);
              if (after_write_called == 7) {
                if (on_pipe_read_called == 0) {
                  if (close_cb_called == 0) {
                    uv_ref((uv_handle_t *)&stdout_pipe);
                    uv_ref((uv_handle_t *)&stdin_pipe);
                    iVar2 = uv_read_start((uv_stream_t *)&stdin_pipe,on_read_alloc,on_pipe_read);
                    if (iVar2 == 0) {
                      uv_run(puVar3,UV_RUN_DEFAULT);
                      if (after_write_called == 7) {
                        if (on_pipe_read_called == 1) {
                          if (close_cb_called == 2) {
                            puVar3 = uv_default_loop();
                            close_loop(puVar3);
                            puVar3 = uv_default_loop();
                            iVar2 = uv_loop_close(puVar3);
                            if (iVar2 == 0) {
                              return 0;
                            }
                            pcVar6 = "0 == uv_loop_close(uv_default_loop())";
                            uVar5 = 0xfe;
                          }
                          else {
                            pcVar6 = "close_cb_called == 2";
                            uVar5 = 0xfc;
                          }
                        }
                        else {
                          pcVar6 = "on_pipe_read_called == 1";
                          uVar5 = 0xfb;
                        }
                      }
                      else {
                        pcVar6 = "after_write_called == 7";
                        uVar5 = 0xfa;
                      }
                    }
                    else {
                      pcVar6 = "r == 0";
                      uVar5 = 0xf6;
                    }
                  }
                  else {
                    pcVar6 = "close_cb_called == 0";
                    uVar5 = 0xf0;
                  }
                }
                else {
                  pcVar6 = "on_pipe_read_called == 0";
                  uVar5 = 0xef;
                }
              }
              else {
                pcVar6 = "after_write_called == 7";
                uVar5 = 0xee;
              }
              goto LAB_0014ece2;
            }
            iVar2 = uv_write(req,(uv_stream_t *)&stdout_pipe,
                             (uv_buf_t *)((long)&buf[0].base + lVar7),1,after_pipe_write);
            lVar7 = lVar7 + 0x10;
            req = req + 1;
          } while (iVar2 == 0);
          pcVar6 = "r == 0";
          uVar5 = 0xe8;
        }
        else {
          pcVar6 = "r == 0";
          uVar5 = 0xd8;
        }
      }
      else {
        pcVar6 = "r == 0";
        uVar5 = 0xd6;
      }
    }
    else {
      pcVar6 = "UV_NAMED_PIPE == uv_guess_handle(1)";
      uVar5 = 0xd3;
    }
  }
  else {
    pcVar6 = "UV_NAMED_PIPE == uv_guess_handle(0)";
    uVar5 = 0xd2;
  }
LAB_0014ece2:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
          ,uVar5,pcVar6);
  abort();
}

Assistant:

int stdio_over_pipes_helper(void) {
  /* Write several buffers to test that the write order is preserved. */
  char* buffers[] = {
    "he",
    "ll",
    "o ",
    "wo",
    "rl",
    "d",
    "\n"
  };

  uv_write_t write_req[ARRAY_SIZE(buffers)];
  uv_buf_t buf[ARRAY_SIZE(buffers)];
  unsigned int i;
  int r;
  uv_loop_t* loop = uv_default_loop();

  ASSERT(UV_NAMED_PIPE == uv_guess_handle(0));
  ASSERT(UV_NAMED_PIPE == uv_guess_handle(1));

  r = uv_pipe_init(loop, &stdin_pipe, 0);
  ASSERT(r == 0);
  r = uv_pipe_init(loop, &stdout_pipe, 0);
  ASSERT(r == 0);

  uv_pipe_open(&stdin_pipe, 0);
  uv_pipe_open(&stdout_pipe, 1);

  /* Unref both stdio handles to make sure that all writes complete. */
  uv_unref((uv_handle_t*)&stdin_pipe);
  uv_unref((uv_handle_t*)&stdout_pipe);

  for (i = 0; i < ARRAY_SIZE(buffers); i++) {
    buf[i] = uv_buf_init((char*)buffers[i], strlen(buffers[i]));
  }

  for (i = 0; i < ARRAY_SIZE(buffers); i++) {
    r = uv_write(&write_req[i], (uv_stream_t*)&stdout_pipe, &buf[i], 1,
      after_pipe_write);
    ASSERT(r == 0);
  }

  notify_parent_process();
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(after_write_called == 7);
  ASSERT(on_pipe_read_called == 0);
  ASSERT(close_cb_called == 0);

  uv_ref((uv_handle_t*)&stdout_pipe);
  uv_ref((uv_handle_t*)&stdin_pipe);

  r = uv_read_start((uv_stream_t*)&stdin_pipe, on_read_alloc, on_pipe_read);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(after_write_called == 7);
  ASSERT(on_pipe_read_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}